

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uv-common.c
# Opt level: O2

int uv_udp_try_send(uv_udp_t *handle,uv_buf_t *bufs,uint nbufs,sockaddr *addr)

{
  int iVar1;
  uint uStack_8;
  
  if (handle->type != UV_UDP) {
    return -0x16;
  }
  if (addr->sa_family == 2) {
    uStack_8 = 0x10;
  }
  else {
    if (addr->sa_family != 10) {
      return -0x16;
    }
    uStack_8 = 0x1c;
  }
  iVar1 = uv__udp_try_send(handle,bufs,nbufs,addr,uStack_8);
  return iVar1;
}

Assistant:

int uv_udp_try_send(uv_udp_t* handle,
                    const uv_buf_t bufs[],
                    unsigned int nbufs,
                    const struct sockaddr* addr) {
  unsigned int addrlen;

  if (handle->type != UV_UDP)
    return UV_EINVAL;

  if (addr->sa_family == AF_INET)
    addrlen = sizeof(struct sockaddr_in);
  else if (addr->sa_family == AF_INET6)
    addrlen = sizeof(struct sockaddr_in6);
  else
    return UV_EINVAL;

  return uv__udp_try_send(handle, bufs, nbufs, addr, addrlen);
}